

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::ExceptionOptions>::copyConstruct
          (BasicTypeInfo<dap::ExceptionOptions> *this,void *dst,void *src)

{
  *(long *)dst = (long)dst + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)dst,*src,*(long *)((long)src + 8) + *src);
  std::vector<dap::ExceptionPathSegment,_std::allocator<dap::ExceptionPathSegment>_>::vector
            ((vector<dap::ExceptionPathSegment,_std::allocator<dap::ExceptionPathSegment>_> *)
             ((long)dst + 0x20),
             (vector<dap::ExceptionPathSegment,_std::allocator<dap::ExceptionPathSegment>_> *)
             ((long)src + 0x20));
  *(undefined1 *)((long)dst + 0x38) = *(undefined1 *)((long)src + 0x38);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }